

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  secp256k1_scratch *scratch;
  ulong extraout_RAX;
  code *pcVar5;
  long lVar6;
  secp256k1_scalar *ng;
  secp256k1_strauss_point_state *psVar7;
  ulong uVar8;
  secp256k1_strauss_point_state *scratch_00;
  secp256k1_gej *r;
  size_t sVar9;
  ulong uVar10;
  byte *out32;
  secp256k1_strauss_point_state *psVar11;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  uchar *p2;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  secp256k1_sha256 *hash_00;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *acc;
  secp256k1_strauss_point_state *r_00;
  uchar inp [6];
  uchar b32 [32];
  ulong uStack_1598;
  secp256k1_strauss_state sStack_1580;
  secp256k1_fe asStack_1568 [8];
  secp256k1_strauss_point_state sStack_1428;
  secp256k1_ge asStack_1018 [8];
  secp256k1_callback *psStack_d48;
  secp256k1_gej *psStack_d40;
  secp256k1_strauss_point_state *psStack_d38;
  secp256k1_strauss_point_state *psStack_d30;
  secp256k1_strauss_point_state *psStack_d28;
  secp256k1_strauss_point_state *psStack_d18;
  undefined1 auStack_d00 [8];
  undefined1 auStack_cf8 [88];
  secp256k1_gej sStack_ca0;
  secp256k1_gej sStack_c20;
  secp256k1_gej sStack_ba0;
  secp256k1_gej sStack_b20;
  secp256k1_gej asStack_aa0 [2];
  secp256k1_strauss_point_state sStack_960;
  secp256k1_gej sStack_550;
  secp256k1_gej sStack_4d0;
  undefined1 auStack_450 [728];
  secp256k1_scratch *psStack_178;
  secp256k1_sha256 *psStack_170;
  size_t sStack_168;
  code *pcStack_160;
  uint32_t local_156;
  undefined2 local_152;
  uchar *local_150;
  byte local_148 [32];
  undefined1 local_128 [40];
  uchar auStack_100 [88];
  int local_a8 [4];
  secp256k1_sha256 local_98;
  
  out32 = (byte *)(ulong)prefix;
  pcStack_160 = (code *)0x16aabf;
  local_150 = expected32;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  acc = &local_98;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  sVar9 = 0;
  local_98.bytes = 0;
  hash_00 = (secp256k1_sha256 *)local_128;
  local_128._0_4_ = 0;
  local_128._4_4_ = 0;
  local_128._8_4_ = 0;
  local_128._12_4_ = 0;
  local_128._16_4_ = 0;
  local_128._20_4_ = 0;
  local_128._24_4_ = 0;
  local_128._28_4_ = 0;
  pcStack_160 = (code *)0x16ab0c;
  local_156 = prefix;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  local_128._0_4_ = 1;
  local_128._4_4_ = 0;
  local_128._8_4_ = 0;
  local_128._12_4_ = 0;
  local_128._16_4_ = 0;
  local_128._20_4_ = 0;
  local_128._24_4_ = 0;
  local_128._28_4_ = 0;
  pcStack_160 = (code *)0x16ab30;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  pcStack_160 = (code *)0x16ab3b;
  secp256k1_scalar_negate((secp256k1_scalar *)hash_00,(secp256k1_scalar *)hash_00);
  pcStack_160 = (code *)0x16ab49;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  if (iter != 0) {
    sVar9 = 0;
    hash_00 = (secp256k1_sha256 *)(local_128 + 0x20);
    out32 = local_148;
    acc = (secp256k1_sha256 *)local_128;
    do {
      local_152 = (undefined2)sVar9;
      local_128[0x20] = 'g';
      local_128[0x21] = 0xe6;
      local_128[0x22] = '\t';
      local_128[0x23] = 'j';
      local_128[0x24] = 0x85;
      local_128[0x25] = 0xae;
      local_128[0x26] = 'g';
      local_128[0x27] = 0xbb;
      auStack_100[0] = 'r';
      auStack_100[1] = 0xf3;
      auStack_100[2] = 'n';
      auStack_100[3] = '<';
      auStack_100[4] = ':';
      auStack_100[5] = 0xf5;
      auStack_100[6] = 'O';
      auStack_100[7] = 0xa5;
      auStack_100[8] = '\x7f';
      auStack_100[9] = 'R';
      auStack_100[10] = '\x0e';
      auStack_100[0xb] = 'Q';
      auStack_100[0xc] = 0x8c;
      auStack_100[0xd] = 'h';
      auStack_100[0xe] = '\x05';
      auStack_100[0xf] = 0x9b;
      auStack_100[0x10] = 0xab;
      auStack_100[0x11] = 0xd9;
      auStack_100[0x12] = 0x83;
      auStack_100[0x13] = '\x1f';
      auStack_100[0x14] = '\x19';
      auStack_100[0x15] = 0xcd;
      auStack_100[0x16] = 0xe0;
      auStack_100[0x17] = '[';
      local_a8[0] = 0;
      local_a8[1] = 0;
      pcStack_160 = (code *)0x16ab9a;
      secp256k1_sha256_write(hash_00,(uchar *)&local_156,6);
      pcStack_160 = (code *)0x16aba5;
      secp256k1_sha256_finalize(hash_00,out32);
      pcStack_160 = (code *)0x16abb2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_160 = (code *)0x16abc5;
      test_ecmult_accumulate(&local_98,(secp256k1_scalar *)acc,scratch);
      sVar9 = sVar9 + 1;
    } while (iter != sVar9);
  }
  pcStack_160 = (code *)0x16abdf;
  secp256k1_sha256_finalize(&local_98,local_148);
  lVar6 = 0;
  uVar10 = extraout_RAX;
  do {
    uVar8 = uVar10 & 0xffffffff;
    bVar2 = local_148[lVar6];
    psVar11 = (secp256k1_strauss_point_state *)(ulong)bVar2;
    bVar3 = local_150[lVar6];
    hash = (secp256k1_sha256 *)(ulong)bVar3;
    uVar10 = (ulong)((uint)bVar2 - (uint)bVar3);
    if (bVar2 == bVar3) {
      uVar10 = uVar8;
    }
    iVar4 = (int)uVar10;
    if (bVar2 != bVar3) goto LAB_0016ac09;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  iVar4 = 0;
LAB_0016ac09:
  if (iVar4 == 0) {
    pcStack_160 = (code *)0x16ac21;
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  pcStack_160 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_d00 = (undefined1  [8])0x41;
  sStack_4d0.infinity = 0;
  sStack_4d0.x.n[0] = 0x2815b16f81798;
  sStack_4d0.x.n[1] = 0xdb2dce28d959f;
  sStack_4d0.x.n[2] = 0xe870b07029bfc;
  sStack_4d0.x.n[3] = 0xbbac55a06295c;
  sStack_4d0.x.n[4] = 0x79be667ef9dc;
  sStack_4d0.y.n[4] = 0x483ada7726a3;
  sStack_4d0.y.n[0] = 0x7d08ffb10d4b8;
  sStack_4d0.y.n[1] = 0x48a68554199c4;
  sStack_4d0.y.n[2] = 0xe1108a8fd17b4;
  sStack_4d0.y.n[3] = 0xc4655da4fbfc0;
  sStack_4d0.z.n[0] = 1;
  sStack_4d0.z.n[1] = 0;
  sStack_4d0.z.n[2] = 0;
  sStack_4d0.z.n[3] = 0;
  sStack_4d0.z.n[4] = 0;
  sStack_550.infinity = 1;
  sStack_550.z.n[4] = 0;
  sStack_550.z.n[2] = 0;
  sStack_550.z.n[3] = 0;
  sStack_550.z.n[0] = 0;
  sStack_550.z.n[1] = 0;
  sStack_550.y.n[3] = 0;
  sStack_550.y.n[4] = 0;
  sStack_550.y.n[1] = 0;
  sStack_550.y.n[2] = 0;
  sStack_550.x.n[4] = 0;
  sStack_550.y.n[0] = 0;
  sStack_550.x.n[2] = 0;
  sStack_550.x.n[3] = 0;
  sStack_550.x.n[0] = 0;
  sStack_550.x.n[1] = 0;
  psStack_d28 = (secp256k1_strauss_point_state *)0x16ad29;
  auStack_450._712_8_ = sVar9;
  auStack_450._720_8_ = hash_00;
  psStack_178 = scratch;
  psStack_170 = acc;
  sStack_168 = iter;
  pcStack_160 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b20,(secp256k1_scalar *)psVar11);
  r_00 = (secp256k1_strauss_point_state *)auStack_450;
  psStack_d28 = (secp256k1_strauss_point_state *)0x16ad76;
  sStack_c20.x.n[0] = (uint64_t)asStack_aa0;
  sStack_c20.x.n[1] = (uint64_t)r_00;
  sStack_c20.x.n[2] = (uint64_t)&sStack_960;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c20,&sStack_ba0,1,&sStack_4d0,
             (secp256k1_scalar *)psVar11,&secp256k1_scalar_zero);
  psStack_d28 = (secp256k1_strauss_point_state *)0x16ada9;
  sStack_ca0.x.n[0] = (uint64_t)asStack_aa0;
  sStack_ca0.x.n[1] = (uint64_t)r_00;
  sStack_ca0.x.n[2] = (uint64_t)&sStack_960;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_ca0,&sStack_c20,1,&sStack_550,&secp256k1_scalar_zero
             ,(secp256k1_scalar *)psVar11);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_d28 = (secp256k1_strauss_point_state *)0x16add8;
  ng = (secp256k1_scalar *)psVar11;
  scratch_01 = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_450,(secp256k1_scalar *)psVar11,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afb5;
    test_ecmult_accumulate_cold_8();
LAB_0016afb5:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afba;
    test_ecmult_accumulate_cold_7();
LAB_0016afba:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afbf;
    test_ecmult_accumulate_cold_6();
LAB_0016afbf:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afc4;
    test_ecmult_accumulate_cold_5();
LAB_0016afc4:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afc9;
    test_ecmult_accumulate_cold_4();
LAB_0016afc9:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afce;
    test_ecmult_accumulate_cold_3();
LAB_0016afce:
    psStack_d28 = (secp256k1_strauss_point_state *)0x16afd3;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    ng = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae13;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar11;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_aa0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar11,1);
    if (iVar4 == 0) goto LAB_0016afb5;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae32;
    secp256k1_ecmult_const(&sStack_ca0,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar11);
    psVar11 = (secp256k1_strauss_point_state *)auStack_cf8;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae47;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar11,&sStack_b20);
    r_00 = &sStack_960;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae5f;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_ba0);
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae6f;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar11,
               (secp256k1_fe *)0x0);
    if (sStack_960.wnaf_na_1[0x1e] == 0) goto LAB_0016afba;
    psVar11 = &sStack_960;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16ae92;
    secp256k1_gej_neg((secp256k1_gej *)psVar11,&sStack_c20);
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16aea4;
    scratch_01 = psVar11;
    elem = psVar11;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar11,(secp256k1_gej *)psVar11,(secp256k1_ge *)auStack_cf8,
               (secp256k1_fe *)0x0);
    if (sStack_960.wnaf_na_1[0x1e] == 0) goto LAB_0016afbf;
    psVar11 = &sStack_960;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16aec7;
    secp256k1_gej_neg((secp256k1_gej *)psVar11,(secp256k1_gej *)auStack_450);
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16aed9;
    scratch_01 = psVar11;
    elem = psVar11;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar11,(secp256k1_gej *)psVar11,(secp256k1_ge *)auStack_cf8,
               (secp256k1_fe *)0x0);
    if (sStack_960.wnaf_na_1[0x1e] == 0) goto LAB_0016afc4;
    psVar11 = &sStack_960;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16aefc;
    secp256k1_gej_neg((secp256k1_gej *)psVar11,asStack_aa0);
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16af0e;
    scratch_01 = psVar11;
    elem = psVar11;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar11,(secp256k1_gej *)psVar11,(secp256k1_ge *)auStack_cf8,
               (secp256k1_fe *)0x0);
    if (sStack_960.wnaf_na_1[0x1e] == 0) goto LAB_0016afc9;
    psVar11 = &sStack_960;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16af31;
    secp256k1_gej_neg((secp256k1_gej *)psVar11,&sStack_ca0);
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16af43;
    scratch_01 = psVar11;
    elem = psVar11;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar11,(secp256k1_gej *)psVar11,(secp256k1_ge *)auStack_cf8,
               (secp256k1_fe *)0x0);
    if (sStack_960.wnaf_na_1[0x1e] == 0) goto LAB_0016afce;
    if (auStack_cf8._80_4_ != 0) {
      sStack_960.wnaf_na_1[0]._0_1_ = 0;
      sVar9 = 1;
LAB_0016af94:
      psStack_d28 = (secp256k1_strauss_point_state *)0x16af9e;
      secp256k1_sha256_write(hash,(uchar *)&sStack_960,sVar9);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_cf8;
    scratch_01 = &sStack_960;
    psVar11 = (secp256k1_strauss_point_state *)auStack_d00;
    ng = (secp256k1_scalar *)0x0;
    psStack_d28 = (secp256k1_strauss_point_state *)0x16af83;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar11,0);
    if (auStack_d00 == (undefined1  [8])0x41) {
      sVar9 = 0x41;
      goto LAB_0016af94;
    }
  }
  psStack_d28 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)ng != (secp256k1_strauss_point_state *)0x0 ||
      psStack_d18 != (secp256k1_strauss_point_state *)0x0) {
    psStack_d48 = error_callback;
    psStack_d40 = &sStack_550;
    psStack_d38 = psVar11;
    psStack_d30 = r_00;
    psStack_d28 = &sStack_960;
    if (psStack_d18 != (secp256k1_strauss_point_state *)0x0) {
      if (scratch_01 != (secp256k1_strauss_point_state *)0x0) {
        sVar9 = secp256k1_pippenger_max_points
                          ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01);
        if (sVar9 != 0) {
          uVar10 = 5000000;
          if (sVar9 < 5000000) {
            uVar10 = sVar9;
          }
          puVar1 = (undefined1 *)((long)psStack_d18[-1].wnaf_na_lam + 0x20b);
          uStack_1598 = (ulong)puVar1 / uVar10 + 1;
          r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_1598 + 1);
        }
        if (sVar9 != 0) {
          if (r_00 < (secp256k1_strauss_point_state *)0x58) {
            sVar9 = secp256k1_scratch_max_allocation
                              ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01,5);
            if (0x8af < sVar9) {
              uVar10 = sVar9 / 0x8b0;
              if (4999999 < uVar10) {
                uVar10 = 5000000;
              }
              puVar1 = (undefined1 *)((long)psStack_d18[-1].wnaf_na_lam + 0x20b);
              uStack_1598 = (ulong)puVar1 / uVar10 + 1;
              r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_1598 + 1);
            }
            if (sVar9 < 0x8b0) goto LAB_0016b190;
            pcVar5 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar5 = secp256k1_ecmult_pippenger_batch;
          }
          lVar6 = 0;
          uVar10 = 0;
          while( true ) {
            psVar11 = r_00;
            if (psStack_d18 < r_00) {
              psVar11 = psStack_d18;
            }
            psVar7 = (secp256k1_strauss_point_state *)0x0;
            if (uVar10 == 0) {
              psVar7 = (secp256k1_strauss_point_state *)ng;
            }
            iVar4 = (*pcVar5)(elem,scratch_01,&sStack_1428,psVar7,cb,cbdata,psVar11,lVar6);
            if (iVar4 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1428,(secp256k1_fe *)0x0);
            psStack_d18 = (secp256k1_strauss_point_state *)((long)psStack_d18 - (long)psVar11);
            uVar10 = uVar10 + 1;
            lVar6 = (long)((secp256k1_fe *)r_00->wnaf_na_1)->n + lVar6;
            if (uStack_1598 == uVar10) {
              return;
            }
          }
          return;
        }
      }
LAB_0016b190:
      secp256k1_ecmult_multi_simple_var(r,ng,cb,cbdata,(size_t)psStack_d18);
      return;
    }
    sStack_1580.aux = asStack_1568;
    sStack_1580.pre_a = asStack_1018;
    sStack_1580.ps = &sStack_1428;
    secp256k1_ecmult_strauss_wnaf(&sStack_1580,r,1,r,&secp256k1_scalar_zero,ng);
  }
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}